

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O0

bool __thiscall
cmm::CMMParser::parseStatement
          (CMMParser *this,
          unique_ptr<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_> *Res)

{
  TokenKind TVar1;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  unique_ptr<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_> *local_20;
  unique_ptr<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_> *Res_local;
  CMMParser *this_local;
  
  local_20 = Res;
  Res_local = (unique_ptr<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_> *)this;
  TVar1 = getKind(this);
  switch(TVar1) {
  case Identifier:
  case String:
  case Integer:
  case Double:
  case Boolean:
  case LParen:
  case Plus:
  case Minus:
  case Exclaim:
  case Tilde:
    this_local._7_1_ = parseExprStatement(this,local_20);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"unexpected token in statement",&local_41);
    this_local._7_1_ = Error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case LCurly:
    this_local._7_1_ = parseBlock(this,local_20);
    break;
  case Semicolon:
    this_local._7_1_ = parseEmptyStatement(this,local_20);
    break;
  case Kw_if:
    this_local._7_1_ = parseIfStatement(this,local_20);
    break;
  case Kw_for:
    this_local._7_1_ = parseForStatement(this,local_20);
    break;
  case Kw_while:
    this_local._7_1_ = parseWhileStatement(this,local_20);
    break;
  case Kw_break:
    this_local._7_1_ = parseBreakStatement(this,local_20);
    break;
  case Kw_continue:
    this_local._7_1_ = parseContinueStatement(this,local_20);
    break;
  case Kw_return:
    this_local._7_1_ = parseReturnStatement(this,local_20);
    break;
  case Kw_string:
  case Kw_int:
  case Kw_double:
  case Kw_bool:
    this_local._7_1_ = parseDeclarationStatement(this,local_20);
    break;
  case Kw_void:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"`void\' only appears before function definition",&local_79);
    this_local._7_1_ = Error(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CMMParser::parseStatement(std::unique_ptr<StatementAST> &Res) {
  switch (getKind()) {
  default:
    return Error("unexpected token in statement");
  case Token::LCurly:       return parseBlock(Res);
  case Token::Kw_if:        return parseIfStatement(Res);
  case Token::Kw_while:     return parseWhileStatement(Res);
  case Token::Kw_for:       return parseForStatement(Res);
  case Token::Kw_return:    return parseReturnStatement(Res);
  case Token::Kw_break:     return parseBreakStatement(Res);
  case Token::Kw_continue:  return parseContinueStatement(Res);
  case Token::Semicolon:    return parseEmptyStatement(Res);
  case Token::Kw_bool:
  case Token::Kw_int:
  case Token::Kw_double:
  case Token::Kw_string:
    return parseDeclarationStatement(Res);
  case Token::Kw_void:
    return Error("`void' only appears before function definition");
  case Token::LParen:   case Token::Identifier:
  case Token::Double:   case Token::String:
  case Token::Boolean:  case Token::Integer:
  case Token::Plus:     case Token::Minus:
  case Token::Tilde:    case Token::Exclaim:
    return parseExprStatement(Res);
  }
}